

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

ssize_t __thiscall
event_track::EventSample::write(EventSample *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  reference this_00;
  ssize_t sVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint local_2c;
  long lStack_28;
  uint y;
  size_t t_size;
  ostream *ostr_local;
  EventSample *this_local;
  
  if (((this->is_emeb_ & 1U) == 0) &&
     (sVar1 = std::
              vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
              ::size(&this->instance_boxes_), sVar1 != 0)) {
    lStack_28 = 0;
    for (local_2c = 0;
        sVar1 = std::
                vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                ::size(&this->instance_boxes_), local_2c < sVar1; local_2c = local_2c + 1) {
      this_00 = std::
                vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                ::operator[](&this->instance_boxes_,(ulong)local_2c);
      sVar2 = EventMessageInstanceBox::write(this_00,__fd,__buf_00,sVar1);
      lStack_28 = lStack_28 + sVar2;
    }
    return lStack_28;
  }
  if ((this->is_vtt_ & 1U) == 0) {
    std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),0x127a27);
  }
  else {
    std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),0x127a2f);
  }
  return 8;
}

Assistant:

size_t write(std::ostream &ostr)
		{
			if (is_emeb_ || instance_boxes_.size() == 0) 
			{
				if (!is_vtt_)
				    ostr.write((const char *)&emeb[0], 8);
				else
					ostr.write((const char*)&vtte[0], 8);
				return 8;
			}
			else 
			{
				size_t t_size = 0;
				for (unsigned int y = 0; y < instance_boxes_.size(); y++)
					t_size+=instance_boxes_[y].write(ostr);
				return t_size;
			}
		}